

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_segment_suite.cpp
# Opt level: O0

void api_suite::api_size(void)

{
  initializer_list<int> input;
  initializer_list<int> input_00;
  undefined4 local_164;
  size_type local_160 [2];
  undefined1 local_150 [8];
  segment last_2;
  size_type local_138 [2];
  undefined1 local_128 [8];
  segment first_2;
  undefined4 local_ec;
  size_type local_e8 [2];
  undefined1 local_d8 [8];
  segment last_1;
  size_type local_c0 [2];
  undefined1 local_b0 [8];
  segment first_1;
  undefined4 local_84;
  size_type local_80 [2];
  undefined1 local_70 [8];
  segment last;
  size_type local_58 [2];
  undefined1 local_48 [8];
  segment first;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  memset(&span.member.next,0,0x10);
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)&first.member.tail,
             (value_type (*) [4])&span.member.next);
  _local_48 = (member_storage<int,_18446744073709551615UL>)
              vista::circular_view<int,_18446744073709551615UL>::first_segment
                        ((circular_view<int,_18446744073709551615UL> *)&first.member.tail);
  local_58[0] = vista::span<int,_18446744073709551615UL>::size
                          ((span<int,_18446744073709551615UL> *)local_48);
  last.member.tail._4_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("first.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x70,"void api_suite::api_size()",local_58,(undefined1 *)((long)&last.member.tail + 4)
            );
  _local_70 = (member_storage<int,_18446744073709551615UL>)
              vista::circular_view<int,_18446744073709551615UL>::last_segment
                        ((circular_view<int,_18446744073709551615UL> *)&first.member.tail);
  local_80[0] = vista::span<int,_18446744073709551615UL>::size
                          ((span<int,_18446744073709551615UL> *)local_70);
  local_84 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("last.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x72,"void api_suite::api_size()",local_80,&local_84);
  first_1.member.tail._4_4_ = 0xb;
  input_00._M_len = 1;
  input_00._M_array = (iterator)((long)&first_1.member.tail + 4);
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)&first.member.tail,input_00);
  _local_b0 = (member_storage<int,_18446744073709551615UL>)
              vista::circular_view<int,_18446744073709551615UL>::first_segment
                        ((circular_view<int,_18446744073709551615UL> *)&first.member.tail);
  local_c0[0] = vista::span<int,_18446744073709551615UL>::size
                          ((span<int,_18446744073709551615UL> *)local_b0);
  last_1.member.tail._4_4_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("first.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x77,"void api_suite::api_size()",local_c0,
             (undefined1 *)((long)&last_1.member.tail + 4));
  _local_d8 = (member_storage<int,_18446744073709551615UL>)
              vista::circular_view<int,_18446744073709551615UL>::last_segment
                        ((circular_view<int,_18446744073709551615UL> *)&first.member.tail);
  local_e8[0] = vista::span<int,_18446744073709551615UL>::size
                          ((span<int,_18446744073709551615UL> *)local_d8);
  local_ec = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("last.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x79,"void api_suite::api_size()",local_e8,&local_ec);
  stack0xfffffffffffffeec = 0x160000000b;
  input._M_len = 5;
  input._M_array = (iterator)((long)&first_2.member.tail + 4);
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)&first.member.tail,input);
  _local_128 = (member_storage<int,_18446744073709551615UL>)
               vista::circular_view<int,_18446744073709551615UL>::first_segment
                         ((circular_view<int,_18446744073709551615UL> *)&first.member.tail);
  local_138[0] = vista::span<int,_18446744073709551615UL>::size
                           ((span<int,_18446744073709551615UL> *)local_128);
  last_2.member.tail._4_4_ = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("first.size()","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x80,"void api_suite::api_size()",local_138,
             (undefined1 *)((long)&last_2.member.tail + 4));
  _local_150 = (member_storage<int,_18446744073709551615UL>)
               vista::circular_view<int,_18446744073709551615UL>::last_segment
                         ((circular_view<int,_18446744073709551615UL> *)&first.member.tail);
  local_160[0] = vista::span<int,_18446744073709551615UL>::size
                           ((span<int,_18446744073709551615UL> *)local_150);
  local_164 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("last.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0x82,"void api_suite::api_size()",local_160,&local_164);
  return;
}

Assistant:

void api_size()
{
    int array[4] = {};
    circular_view<int> span(array);
    {
        auto first = span.first_segment();
        BOOST_TEST_EQ(first.size(), 0);
        auto last = span.last_segment();
        BOOST_TEST_EQ(last.size(), 0);
    }
    span = { 11 };
    {
        auto first = span.first_segment();
        BOOST_TEST_EQ(first.size(), 1);
        auto last = span.last_segment();
        BOOST_TEST_EQ(last.size(), 0);
    }
    // 55 22 33 44
    // -> <-------
    span = { 11, 22, 33, 44, 55 };
    {
        auto first = span.first_segment();
        BOOST_TEST_EQ(first.size(), 3);
        auto last = span.last_segment();
        BOOST_TEST_EQ(last.size(), 1);
    }
}